

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

string * piksel::readFile(string *__return_storage_ptr__,string *filename)

{
  stringstream ss;
  ifstream ifs;
  stringstream asStack_398 [16];
  ostream local_388 [112];
  ios_base local_318 [264];
  undefined1 local_210 [16];
  streambuf local_200 [504];
  
  std::ifstream::ifstream(local_210,(filename->_M_dataplus)._M_p,_S_in);
  std::__cxx11::stringstream::stringstream(asStack_398);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_398);
  std::ios_base::~ios_base(local_318);
  std::ifstream::~ifstream(local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string readFile(const std::string& filename) {
    std::ifstream ifs(filename.c_str());
    std::stringstream ss;
    ss << ifs.rdbuf();
    return ss.str();
}